

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addTimingEvent
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,time_point queuedTime,
          string *tag,cl_command_queue queue,cl_event event)

{
  _List_node_base *p_Var1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  pthread_mutex_t *__mutex;
  float __x;
  allocator local_71;
  cl_device_id device;
  pthread_mutex_t *local_68;
  duration local_60;
  cl_command_queue queue_local;
  cl_ulong hostTimeNS;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_60 = queuedTime.__d.__r;
  queue_local = queue;
  std::mutex::lock((mutex *)&__mutex->__data);
  if (event == (cl_event)0x0) {
    logf(this,__x);
  }
  else {
    std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::
    emplace_back<>(&this->m_EventList);
    p_Var1 = (this->m_EventList).
             super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    device = (cl_device_id)0x0;
    local_68 = __mutex;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
    cacheDeviceInfo(this,device);
    (*(this->m_Dispatch).clRetainEvent)(event);
    p_Var1[1]._M_next = (_List_node_base *)device;
    pmVar2 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](&this->m_QueueNumberMap,&queue_local);
    *(mapped_type *)&p_Var1[1]._M_prev = *pmVar2;
    if (tag->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&hostTimeNS,functionName,&local_71);
    }
    else {
      std::__cxx11::string::string((string *)&hostTimeNS,(string *)tag);
    }
    std::__cxx11::string::_M_assign((string *)(p_Var1 + 2));
    std::__cxx11::string::~string((string *)&hostTimeNS);
    p_Var1[4]._M_next = (_List_node_base *)enqueueCounter;
    p_Var1[4]._M_prev = (_List_node_base *)local_60.__r;
    *(undefined1 *)&p_Var1[5]._M_next = 0;
    p_Var1[5]._M_prev = (_List_node_base *)0x0;
    p_Var1[6]._M_next = (_List_node_base *)event;
    __mutex = local_68;
    if ((device != (cl_device_id)0x0) &&
       (pmVar3 = std::
                 map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                 ::operator[](&this->m_DeviceInfoMap,&device), __mutex = local_68,
       pmVar3->HasDeviceAndHostTimer == true)) {
      lVar4 = std::chrono::_V2::steady_clock::now();
      hostTimeNS = 0;
      (*(this->m_Dispatch).clGetHostTimer)(device,&hostTimeNS);
      lVar5 = std::chrono::_V2::steady_clock::now();
      *(undefined1 *)&p_Var1[5]._M_next = 1;
      p_Var1[5]._M_prev =
           (_List_node_base *)
           ((((ulong)(lVar5 - lVar4) >> 1) + lVar4) - (hostTimeNS + pmVar3->DeviceHostTimeDeltaNS));
      __mutex = local_68;
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::addTimingEvent(
    const char* functionName,
    const uint64_t enqueueCounter,
    const clock::time_point queuedTime,
    const std::string& tag,
    const cl_command_queue queue,
    cl_event event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( event == NULL )
    {
        logf( "Unexpectedly got a NULL timing event for %s, check for OpenCL errors!\n",
            functionName );
        return;
    }

    m_EventList.emplace_back();

    SEventListNode& node = m_EventList.back();

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    dispatch().clRetainEvent( event );

    node.Device = device;
    node.QueueNumber = m_QueueNumberMap[ queue ];
    node.Name = !tag.empty() ? tag : functionName;
    node.EnqueueCounter = enqueueCounter;
    node.QueuedTime = queuedTime;
    node.UseProfilingDelta = false;
    node.ProfilingDeltaNS = 0;
    node.Event = event;

    if( device )
    {
        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        // Note: Even though ideally the intercept timer and the host timer should advance
        // at a consistent rate and hence the delta between the two timers should remain
        // constant, empirically this does not appear to be the case.  Synchronizing the
        // two timers is relatively inexpensive, and reduces the timer drift, so compute
        // the current delta for each event.

        if( deviceInfo.HasDeviceAndHostTimer )
        {
            // These conditions should have been checked for HasDeviceAndHostTimer to be true:
            CLI_ASSERT( deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) );
            CLI_ASSERT( dispatch().clGetHostTimer );

            using ns = std::chrono::nanoseconds;
            const uint64_t  interceptTimeStartNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            cl_ulong    hostTimeNS = 0;
            dispatch().clGetHostTimer(
                device,
                &hostTimeNS);

            const uint64_t  interceptTimeEndNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            const int64_t   interceptHostTimeDeltaNS =
                ( interceptTimeEndNS - interceptTimeStartNS ) / 2 +
                ( interceptTimeStartNS - hostTimeNS );

            node.UseProfilingDelta = true;
            node.ProfilingDeltaNS =
                interceptHostTimeDeltaNS -
                deviceInfo.DeviceHostTimeDeltaNS;

            //logf( "Current Profiling Delta is %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept to Host Timer delta: %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept Start %llu ns, Intercept End %llu ns (delta %lld ns)\n"
            //    "\tHost %llu ns\n",
            //    node.ProfilingDeltaNS, node.ProfilingDeltaNS / 1000.0, node.ProfilingDeltaNS / 1000000.0,
            //    interceptHostTimeDeltaNS, interceptHostTimeDeltaNS / 1000.0, interceptHostTimeDeltaNS / 1000000.0,
            //    interceptTimeStartNS, interceptTimeEndNS, interceptTimeEndNS - interceptTimeStartNS,
            //    hostTimeNS );
        }
    }
}